

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O2

void __thiscall wabt::ArrayType::ArrayType(ArrayType *this,string_view name)

{
  Location LStack_38;
  
  LStack_38.field_1.field_0.line = 0;
  LStack_38.field_1._4_8_ = 0;
  LStack_38.filename.data_ = (char *)0x0;
  LStack_38.filename.size_._0_4_ = 0;
  LStack_38.filename.size_._4_4_ = 0;
  TypeEntry::TypeEntry(&this->super_TypeEntry,Array,(string_view)ZEXT816(0),&LStack_38);
  (this->super_TypeEntry)._vptr_TypeEntry = (_func_int **)&PTR__ArrayType_001aa518;
  (this->field).name._M_dataplus._M_p = (pointer)&(this->field).name.field_2;
  (this->field).name._M_string_length = 0;
  (this->field).name.field_2._M_local_buf[0] = '\0';
  (this->field).type.enum_ = Void;
  (this->field).mutable_ = false;
  return;
}

Assistant:

explicit ArrayType(string_view name = string_view())
      : TypeEntry(TypeEntryKind::Array) {}